

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Memory::Copy(Memory *dst,u64 dst_offset,Memory *src,u64 src_offset,u64 size)

{
  pointer puVar1;
  pointer puVar2;
  Enum EVar3;
  ulong uVar4;
  
  puVar1 = (dst->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(dst->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  EVar3 = Error;
  if (((size + dst_offset <= uVar4) && (size <= uVar4)) && (dst_offset <= uVar4)) {
    puVar2 = (src->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(src->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (((size + src_offset <= uVar4) && (size <= uVar4)) && (src_offset <= uVar4)) {
      EVar3 = Ok;
      if (size != 0) {
        memmove(puVar1 + dst_offset,puVar2 + src_offset,size);
        EVar3 = Ok;
      }
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Memory::Copy(Memory& dst,
                    u64 dst_offset,
                    const Memory& src,
                    u64 src_offset,
                    u64 size) {
  if (dst.IsValidAccess(dst_offset, 0, size) &&
      src.IsValidAccess(src_offset, 0, size)) {
#if WABT_BIG_ENDIAN
    auto src_begin = src.data_.end() - src_offset - size;
    auto dst_begin = dst.data_.end() - dst_offset - size;
#else
    auto src_begin = src.data_.begin() + src_offset;
    auto dst_begin = dst.data_.begin() + dst_offset;
#endif
    auto src_end = src_begin + size;
    auto dst_end = dst_begin + size;
    if (src.self() == dst.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}